

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_connections_limit(session_impl *this)

{
  session_settings *this_00;
  pointer psVar1;
  torrent *this_01;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  iterator __begin4;
  pointer psVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int local_54;
  error_code local_40;
  
  this_00 = &this->m_settings;
  iVar4 = session_settings::get_int(this_00,0x4055);
  if (iVar4 < 1) {
    iVar4 = max_open_files();
  }
  session_settings::set_int(this_00,0x4055,iVar4);
  sVar3 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar4 = session_settings::get_int(this_00,0x4055);
  if ((iVar4 < (int)sVar3) &&
     ((this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    sVar3 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_54 = session_settings::get_int(this_00,0x4055);
    local_54 = (int)sVar3 - local_54;
    iVar4 = session_settings::get_int(this_00,0x4055);
    uVar11 = (long)iVar4 /
             (long)(int)((ulong)((long)(this->m_torrents).m_array.
                                       super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_torrents).m_array.
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) & 0xffffffff;
    iVar4 = session_settings::get_int(this_00,0x4055);
    psVar6 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)iVar4 %
            (long)(int)((ulong)((long)(this->m_torrents).m_array.
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6) >>
                       4);
    iVar4 = 0;
    uVar10 = 0;
    while( true ) {
      uVar8 = uVar8 & 0xffffffff;
      uVar12 = (uint)uVar11;
      if (iVar4 == 4) break;
      psVar1 = (this->m_torrents).m_array.
               super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar9 = 0;
      for (; iVar7 = (int)uVar8, psVar6 != psVar1; psVar6 = psVar6 + 1) {
        iVar5 = torrent::num_peers((psVar6->
                                   super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
        if ((int)uVar10 < iVar5) {
          iVar2 = uVar12 - iVar5;
          if (uVar12 - iVar5 == 0 || (int)uVar12 < iVar5) {
            iVar2 = 0;
          }
          iVar9 = iVar9 + (uint)((int)uVar12 < iVar5);
          uVar8 = (ulong)(uint)(iVar7 + iVar2);
        }
      }
      iVar9 = iVar9 + (uint)(iVar9 == 0);
      uVar8 = (long)iVar7 % (long)iVar9;
      uVar10 = iVar7 / iVar9 + uVar12;
      uVar11 = (ulong)uVar10;
      if (iVar7 == 0) {
        psVar6 = (this->m_torrents).m_array.
                 super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = 0;
        uVar12 = uVar10;
        break;
      }
      iVar4 = iVar4 + 1;
      psVar6 = (this->m_torrents).m_array.
               super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar12;
    }
    psVar1 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (; psVar6 != psVar1; psVar6 = psVar6 + 1) {
      iVar4 = torrent::num_peers((psVar6->
                                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr);
      if ((int)uVar12 < iVar4) {
        uVar10 = (uint)(0 < (int)uVar8);
        uVar8 = (ulong)((int)uVar8 - uVar10);
        iVar4 = iVar4 - (uVar10 + uVar12);
        if (local_54 <= iVar4) {
          iVar4 = local_54;
        }
        local_54 = local_54 - iVar4;
        this_01 = (psVar6->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr;
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_40,too_many_connections,(type *)0x0);
        torrent::disconnect_peers(this_01,iVar4,&local_40);
      }
    }
  }
  return;
}

Assistant:

void session_impl::update_connections_limit()
	{
		int limit = m_settings.get_int(settings_pack::connections_limit);

		if (limit <= 0) limit = max_open_files();

		m_settings.set_int(settings_pack::connections_limit, limit);

		if (num_connections() > m_settings.get_int(settings_pack::connections_limit)
			&& !m_torrents.empty())
		{
			// if we have more connections that we're allowed, disconnect
			// peers from the torrents so that they are all as even as possible

			int to_disconnect = num_connections() - m_settings.get_int(settings_pack::connections_limit);

			int last_average = 0;
			int average = m_settings.get_int(settings_pack::connections_limit) / int(m_torrents.size());

			// the number of slots that are unused by torrents
			int extra = m_settings.get_int(settings_pack::connections_limit) % int(m_torrents.size());

			// run 3 iterations of this, then we're probably close enough
			for (int iter = 0; iter < 4; ++iter)
			{
				// the number of torrents that are above average
				int num_above = 0;
				for (auto const& t : m_torrents)
				{
					int const num = t->num_peers();
					if (num <= last_average) continue;
					if (num > average) ++num_above;
					if (num < average) extra += average - num;
				}

				// distribute extra among the torrents that are above average
				if (num_above == 0) num_above = 1;
				last_average = average;
				average += extra / num_above;
				if (extra == 0) break;
				// save the remainder for the next iteration
				extra = extra % num_above;
			}

			for (auto const& t : m_torrents)
			{
				int const num = t->num_peers();
				if (num <= average) continue;

				// distribute the remainder
				int my_average = average;
				if (extra > 0)
				{
					++my_average;
					--extra;
				}

				int const disconnect = std::min(to_disconnect, num - my_average);
				to_disconnect -= disconnect;
				t->disconnect_peers(disconnect, errors::too_many_connections);
			}
		}
	}